

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall
ExpressionContext::ExpressionContext
          (ExpressionContext *this,Allocator *allocator,int optimizationLevel)

{
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this_00;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar1;
  uint i;
  uint uVar2;
  
  this->optimizationLevel = optimizationLevel;
  (this->uniqueDependencies).allocator = (Allocator *)0x0;
  (this->uniqueDependencies).data = (this->uniqueDependencies).little;
  (this->uniqueDependencies).count = 0;
  (this->uniqueDependencies).max = 0x80;
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::SmallDenseMap
            (&this->uniqueDependencyMap,(Allocator *)0x0);
  (this->imports).allocator = (Allocator *)0x0;
  (this->imports).data = (this->imports).little;
  (this->imports).count = 0;
  (this->imports).max = 0x80;
  (this->implicitImports).allocator = (Allocator *)0x0;
  (this->implicitImports).data = (this->implicitImports).little;
  (this->implicitImports).count = 0;
  (this->implicitImports).max = 0x80;
  (this->namespaces).allocator = (Allocator *)0x0;
  (this->namespaces).data = (this->namespaces).little;
  (this->namespaces).count = 0;
  (this->namespaces).max = 0x80;
  (this->types).allocator = (Allocator *)0x0;
  (this->types).data = (this->types).little;
  (this->types).count = 0;
  (this->types).max = 0x80;
  (this->functions).allocator = (Allocator *)0x0;
  (this->functions).data = (this->functions).little;
  (this->functions).count = 0;
  (this->functions).max = 0x80;
  (this->variables).allocator = (Allocator *)0x0;
  (this->variables).data = (this->variables).little;
  (this->variables).max = 0x80;
  (this->variables).count = 0;
  (this->definitions).allocator = (Allocator *)0x0;
  (this->definitions).data = (this->definitions).little;
  (this->definitions).count = 0;
  (this->definitions).max = 0x80;
  (this->setup).allocator = (Allocator *)0x0;
  (this->setup).data = (this->setup).little;
  (this->setup).count = 0;
  (this->setup).max = 0x80;
  (this->vtables).allocator = (Allocator *)0x0;
  (this->vtables).data = (this->vtables).little;
  (this->vtables).count = 0;
  (this->vtables).max = 0x80;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::SmallDenseMap
            (&this->vtableMap,(Allocator *)0x0);
  (this->upvalues).allocator = (Allocator *)0x0;
  (this->upvalues).data = (this->upvalues).little;
  (this->upvalues).count = 0;
  (this->upvalues).max = 0x80;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::SmallDenseMap
            (&this->upvalueMap,(Allocator *)0x0);
  (this->functionTypes).allocator = (Allocator *)0x0;
  (this->functionTypes).data = (this->functionTypes).little;
  (this->functionTypes).count = 0;
  (this->functionTypes).max = 0x80;
  (this->functionSetTypes).allocator = (Allocator *)0x0;
  (this->functionSetTypes).data = (this->functionSetTypes).little;
  (this->functionSetTypes).count = 0;
  (this->functionSetTypes).max = 0x80;
  (this->genericAliasTypes).allocator = (Allocator *)0x0;
  (this->genericAliasTypes).data = (this->genericAliasTypes).little;
  (this->genericAliasTypes).count = 0;
  (this->genericAliasTypes).max = 0x80;
  (this->genericClassTypes).allocator = (Allocator *)0x0;
  (this->genericClassTypes).data = (this->genericClassTypes).little;
  (this->genericClassTypes).count = 0;
  (this->genericClassTypes).max = 0x80;
  (this->genericTypeMap).nodePool.first = (StackChunk *)0x0;
  (this->genericTypeMap).nodePool.curr = (StackChunk *)0x0;
  (this->genericTypeMap).nodePool.size = 0xffc;
  (this->genericTypeMap).allocator = (Allocator *)0x0;
  (this->genericTypeMap).freeList.allocator = (Allocator *)0x0;
  (this->genericTypeMap).freeList.data = (this->genericTypeMap).freeList.little;
  (this->genericTypeMap).freeList.max = 0x20;
  (this->genericTypeMap).freeList.count = 0;
  (this->genericTypeMap).entries = (Node **)0x0;
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  ::SmallDenseMap(&this->genericFunctionInstanceTypeMap,(Allocator *)0x0);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::SmallDenseSet
            (&this->noAssignmentOperatorForTypePair,(Allocator *)0x0);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::SmallDenseSet
            (&this->noIndexOperatorForTypePair,(Allocator *)0x0);
  FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::FixedArray
            (&this->noUnaryOperatorForTypePair);
  FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::FixedArray
            (&this->noBinaryOperatorForTypePair);
  FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::FixedArray
            (&this->noModifyOperatorForTypePair);
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
  SmallDenseMap(&this->newConstructorFunctions,(Allocator *)0x0);
  (this->globalNamespaces).allocator = (Allocator *)0x0;
  (this->globalNamespaces).data = (this->globalNamespaces).little;
  (this->globalNamespaces).count = 0;
  (this->globalNamespaces).max = 2;
  (this->globalCloseUpvalues).head = (CloseUpvaluesData *)0x0;
  (this->globalCloseUpvalues).tail = (CloseUpvaluesData *)0x0;
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::SmallDenseMap
            (&this->internalTypeMap,(Allocator *)0x0);
  DirectChainedMap<TypeFunction_*>::DirectChainedMap(&this->functionTypeMap,allocator);
  (this->errorInfo).allocator = (Allocator *)0x0;
  (this->errorInfo).data = (this->errorInfo).little;
  (this->errorInfo).count = 0;
  (this->errorInfo).max = 4;
  CompilerStatistics::CompilerStatistics(&this->statistics);
  this->allocator = allocator;
  this->baseModuleFunctionCount = 0;
  this->code = (char *)0x0;
  this->codeEnd = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  SmallArray<ModuleData_*,_128U>::set_allocator(&this->uniqueDependencies,allocator);
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::set_allocator
            (&this->uniqueDependencyMap,allocator);
  SmallArray<ModuleData_*,_128U>::set_allocator(&this->imports,allocator);
  SmallArray<ModuleData_*,_128U>::set_allocator(&this->implicitImports,allocator);
  SmallArray<NamespaceData_*,_128U>::set_allocator(&this->namespaces,allocator);
  SmallArray<TypeBase_*,_128U>::set_allocator(&this->types,allocator);
  SmallArray<FunctionData_*,_128U>::set_allocator(&this->functions,allocator);
  SmallArray<VariableData_*,_128U>::set_allocator(&this->variables,allocator);
  SmallArray<ExprBase_*,_128U>::set_allocator(&this->definitions,allocator);
  SmallArray<ExprBase_*,_128U>::set_allocator(&this->setup,allocator);
  SmallArray<VariableData_*,_128U>::set_allocator(&this->vtables,allocator);
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::set_allocator
            (&this->vtableMap,allocator);
  SmallArray<VariableData_*,_128U>::set_allocator(&this->upvalues,allocator);
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::set_allocator
            (&this->upvalueMap,allocator);
  SmallArray<TypeFunction_*,_128U>::set_allocator(&this->functionTypes,allocator);
  SmallArray<TypeFunctionSet_*,_128U>::set_allocator(&this->functionSetTypes,allocator);
  SmallArray<TypeGenericAlias_*,_128U>::set_allocator(&this->genericAliasTypes,allocator);
  SmallArray<TypeGenericClass_*,_128U>::set_allocator(&this->genericClassTypes,allocator);
  HashMap<TypeClass_*>::set_allocator(&this->genericTypeMap,allocator);
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  ::set_allocator(&this->genericFunctionInstanceTypeMap,allocator);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::set_allocator
            (&this->noAssignmentOperatorForTypePair,allocator);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::set_allocator
            (&this->noIndexOperatorForTypePair,allocator);
  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
    this_00 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                        (&this->noUnaryOperatorForTypePair,uVar2);
    SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::set_allocator(this_00,allocator);
  }
  for (uVar2 = 0; uVar2 != 0x15; uVar2 = uVar2 + 1) {
    pSVar1 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                       (&this->noBinaryOperatorForTypePair,uVar2);
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::set_allocator(pSVar1,allocator);
  }
  for (uVar2 = 0; uVar2 != 0xb; uVar2 = uVar2 + 1) {
    pSVar1 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                       (&this->noModifyOperatorForTypePair,uVar2);
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::set_allocator(pSVar1,allocator);
  }
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
  set_allocator(&this->newConstructorFunctions,allocator);
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::set_allocator
            (&this->internalTypeMap,allocator);
  this->errorHandlerActive = false;
  this->errorHandlerNested = false;
  this->errorPos = (char *)0x0;
  this->errorCount = 0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->errorBufLocation = (char *)0x0;
  SmallArray<ErrorInfo_*,_4U>::set_allocator(&this->errorInfo,allocator);
  this->globalScope = (ScopeData *)0x0;
  this->scope = (ScopeData *)0x0;
  this->lookupLocation = (SynBase *)0x0;
  this->typeVoid = (TypeBase *)0x0;
  this->typeBool = (TypeBase *)0x0;
  this->typeChar = (TypeBase *)0x0;
  this->typeShort = (TypeBase *)0x0;
  this->typeInt = (TypeBase *)0x0;
  this->typeLong = (TypeBase *)0x0;
  this->typeFloat = (TypeBase *)0x0;
  this->typeDouble = (TypeBase *)0x0;
  this->typeTypeID = (TypeBase *)0x0;
  this->typeFunctionID = (TypeBase *)0x0;
  this->typeNullPtr = (TypeBase *)0x0;
  this->typeGeneric = (TypeBase *)0x0;
  this->typeAuto = (TypeBase *)0x0;
  this->typeAutoRef = (TypeStruct *)0x0;
  this->typeAutoArray = (TypeStruct *)0x0;
  SmallArray<NamespaceData_*,_2U>::set_allocator(&this->globalNamespaces,allocator);
  this->functionInstanceDepth = 0;
  this->classInstanceDepth = 0;
  this->expressionDepth = 0;
  this->memoryLimit = 0;
  HashMap<TypeClass_*>::init(&this->genericTypeMap,(EVP_PKEY_CTX *)allocator);
  this->uniqueAliasId = 0;
  this->uniqueScopeId = 0;
  this->unnamedFuncCount = 0;
  this->unnamedVariableCount = 0;
  this->uniqueNamespaceId = 0;
  this->uniqueVariableId = 0;
  this->uniqueFunctionId = 0;
  this->uniqueAliasId = 0;
  return;
}

Assistant:

ExpressionContext::ExpressionContext(Allocator *allocator, int optimizationLevel): optimizationLevel(optimizationLevel), functionTypeMap(allocator), allocator(allocator)
{
	code = NULL;
	codeEnd = NULL;

	moduleRoot = NULL;

	baseModuleFunctionCount = 0;

	uniqueDependencies.set_allocator(allocator);
	uniqueDependencyMap.set_allocator(allocator);

	imports.set_allocator(allocator);
	implicitImports.set_allocator(allocator);
	namespaces.set_allocator(allocator);
	types.set_allocator(allocator);
	functions.set_allocator(allocator);
	variables.set_allocator(allocator);

	definitions.set_allocator(allocator);
	setup.set_allocator(allocator);

	vtables.set_allocator(allocator);
	vtableMap.set_allocator(allocator);

	upvalues.set_allocator(allocator);
	upvalueMap.set_allocator(allocator);

	functionTypes.set_allocator(allocator);
	functionSetTypes.set_allocator(allocator);
	genericAliasTypes.set_allocator(allocator);
	genericClassTypes.set_allocator(allocator);

	genericTypeMap.set_allocator(allocator);

	genericFunctionInstanceTypeMap.set_allocator(allocator);

	noAssignmentOperatorForTypePair.set_allocator(allocator);

	noIndexOperatorForTypePair.set_allocator(allocator);

	for(unsigned i = 0; i < noUnaryOperatorForTypePair.size(); i++)
		noUnaryOperatorForTypePair[i].set_allocator(allocator);

	for(unsigned i = 0; i < noBinaryOperatorForTypePair.size(); i++)
		noBinaryOperatorForTypePair[i].set_allocator(allocator);

	for(unsigned i = 0; i < noModifyOperatorForTypePair.size(); i++)
		noModifyOperatorForTypePair[i].set_allocator(allocator);

	newConstructorFunctions.set_allocator(allocator);

	internalTypeMap.set_allocator(allocator);

	errorHandlerActive = false;
	errorHandlerNested = false;
	errorPos = NULL;
	errorCount = 0;
	errorBuf = NULL;
	errorBufSize = 0;
	errorBufLocation = NULL;

	errorInfo.set_allocator(allocator);

	typeVoid = NULL;

	typeBool = NULL;

	typeChar = NULL;
	typeShort = NULL;
	typeInt = NULL;
	typeLong = NULL;

	typeFloat = NULL;
	typeDouble = NULL;

	typeTypeID = NULL;
	typeFunctionID = NULL;
	typeNullPtr = NULL;

	typeGeneric = NULL;

	typeAuto = NULL;
	typeAutoRef = NULL;
	typeAutoArray = NULL;

	scope = NULL;
	lookupLocation = NULL;

	globalScope = NULL;
	globalNamespaces.set_allocator(allocator);

	functionInstanceDepth = 0;
	classInstanceDepth = 0;
	expressionDepth = 0;

	memoryLimit = 0;

	genericTypeMap.init();

	uniqueNamespaceId = 0;
	uniqueVariableId = 0;
	uniqueFunctionId = 0;
	uniqueAliasId = 0;
	uniqueScopeId = 0;

	unnamedFuncCount = 0;
	unnamedVariableCount = 0;
}